

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall
DLevelScript::DoFadeRange
          (DLevelScript *this,int r1,int g1,int b1,int a1,int r2,int g2,int b2,int a2,int time)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  AActor *pAVar5;
  DFlashFader *this_00;
  player_t *ppVar6;
  ulong uVar7;
  float r2_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_58 [32];
  undefined1 local_38 [16];
  
  local_58._4_4_ = (float)b2;
  local_58._0_4_ = (float)g2;
  local_58._8_8_ = 0;
  if (a1 < 0) {
    local_38 = ZEXT416(0);
  }
  else {
    auVar8._0_4_ = (float)r1;
    auVar8._4_4_ = (float)g1;
    auVar8._8_4_ = (float)b1;
    auVar8._12_4_ = (float)a1;
    auVar9 = divps(auVar8,_DAT_005c7560);
    local_38._0_12_ = auVar9._0_12_;
    local_38._12_4_ = auVar8._12_4_ * 1.5258789e-05;
  }
  r2_00 = (float)r2 / 255.0;
  auVar8 = divps(local_58._0_16_,_DAT_005b0030);
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
  if (pAVar5 != (AActor *)0x0) {
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
    ppVar6 = pAVar5->player;
    if (ppVar6 == (player_t *)0x0) {
      return;
    }
    uVar7 = 8;
    do {
      if ((float)time * 1.5258789e-05 <= 0.0) {
        ppVar6->BlendR = r2_00;
        local_58._0_8_ = auVar8._0_8_;
        ppVar6->BlendG = (float)local_58._0_4_;
        ppVar6->BlendB = (float)local_58._4_4_;
        ppVar6->BlendA = (float)a2 * 1.5258789e-05;
      }
      else {
        local_58._0_4_ = auVar8._0_4_;
        local_58._4_4_ = auVar8._4_4_;
        if (a1 < 0) {
          local_38._4_4_ = local_58._0_4_;
          local_38._0_4_ = r2_00;
          local_38._8_4_ = local_58._4_4_;
          local_38._12_4_ = 0;
          if (0.0 < ppVar6->BlendA) {
            uVar1 = ppVar6->BlendB;
            uVar3 = ppVar6->BlendR;
            uVar4 = ppVar6->BlendG;
            local_38._4_4_ = uVar4;
            local_38._0_4_ = uVar3;
            local_38._8_4_ = uVar1;
            local_38._12_4_ = ppVar6->BlendA;
          }
        }
        this_00 = (DFlashFader *)DObject::operator_new(0x68);
        DFlashFader::DFlashFader
                  (this_00,local_38._0_4_,local_38._4_4_,local_38._8_4_,local_38._12_4_,r2_00,
                   (float)local_58._0_4_,(float)local_58._4_4_,(float)a2 * 1.5258789e-05,
                   (float)time * 1.5258789e-05,&ppVar6->mo->super_AActor);
      }
      do {
        iVar2 = (int)uVar7;
        uVar7 = (ulong)(iVar2 + 1);
        if (6 < iVar2) {
          return;
        }
LAB_003cf8fc:
      } while (playeringame[uVar7] != true);
      ppVar6 = (player_t *)(&players + uVar7 * 0x54);
    } while( true );
  }
  uVar7 = 0;
  goto LAB_003cf8fc;
}

Assistant:

void DLevelScript::DoFadeRange (int r1, int g1, int b1, int a1,
								int r2, int g2, int b2, int a2, int time)
{
	player_t *viewer;
	float ftime = (float)time / 65536.f;
	bool fadingFrom = a1 >= 0;
	float fr1 = 0, fg1 = 0, fb1 = 0, fa1 = 0;
	float fr2, fg2, fb2, fa2;
	int i;

	fr2 = (float)r2 / 255.f;
	fg2 = (float)g2 / 255.f;
	fb2 = (float)b2 / 255.f;
	fa2 = (float)a2 / 65536.f;

	if (fadingFrom)
	{
		fr1 = (float)r1 / 255.f;
		fg1 = (float)g1 / 255.f;
		fb1 = (float)b1 / 255.f;
		fa1 = (float)a1 / 65536.f;
	}

	if (activator != NULL)
	{
		viewer = activator->player;
		if (viewer == NULL)
			return;
		i = MAXPLAYERS;
		goto showme;
	}
	else
	{
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
			{
				viewer = &players[i];
showme:
				if (ftime <= 0.f)
				{
					viewer->BlendR = fr2;
					viewer->BlendG = fg2;
					viewer->BlendB = fb2;
					viewer->BlendA = fa2;
				}
				else
				{
					if (!fadingFrom)
					{
						if (viewer->BlendA <= 0.f)
						{
							fr1 = fr2;
							fg1 = fg2;
							fb1 = fb2;
							fa1 = 0.f;
						}
						else
						{
							fr1 = viewer->BlendR;
							fg1 = viewer->BlendG;
							fb1 = viewer->BlendB;
							fa1 = viewer->BlendA;
						}
					}
					new DFlashFader (fr1, fg1, fb1, fa1, fr2, fg2, fb2, fa2, ftime, viewer->mo);
				}
			}
		}
	}
}